

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

xmlRelaxNGStatesPtr xmlRelaxNGNewStates(xmlRelaxNGValidCtxtPtr ctxt,int size)

{
  xmlRelaxNGValidityErrorFunc p_Var1;
  xmlRelaxNGStatesPtr ret;
  int size_local;
  xmlRelaxNGValidCtxtPtr ctxt_local;
  
  if (((ctxt == (xmlRelaxNGValidCtxtPtr)0x0) || (ctxt->freeStates == (xmlRelaxNGStatesPtr *)0x0)) ||
     (ctxt->freeStatesNr < 1)) {
    ret._4_4_ = size;
    if (size < 0x10) {
      ret._4_4_ = 0x10;
    }
    ctxt_local = (xmlRelaxNGValidCtxtPtr)(*xmlMalloc)((long)(ret._4_4_ + -1) * 8 + 0x10);
    if (ctxt_local == (xmlRelaxNGValidCtxtPtr)0x0) {
      xmlRngVErrMemory(ctxt,"allocating states\n");
      ctxt_local = (xmlRelaxNGValidCtxtPtr)0x0;
    }
    else {
      *(undefined4 *)&ctxt_local->userData = 0;
      *(int *)((long)&ctxt_local->userData + 4) = ret._4_4_;
      p_Var1 = (xmlRelaxNGValidityErrorFunc)(*xmlMalloc)((long)ret._4_4_ << 3);
      ctxt_local->error = p_Var1;
      if (ctxt_local->error == (xmlRelaxNGValidityErrorFunc)0x0) {
        xmlRngVErrMemory(ctxt,"allocating states\n");
        (*xmlFree)(ctxt_local);
        ctxt_local = (xmlRelaxNGValidCtxtPtr)0x0;
      }
    }
  }
  else {
    ctxt->freeStatesNr = ctxt->freeStatesNr + -1;
    ctxt_local = (xmlRelaxNGValidCtxtPtr)ctxt->freeStates[ctxt->freeStatesNr];
    *(int *)&ctxt_local->userData = 0;
  }
  return (xmlRelaxNGStatesPtr)ctxt_local;
}

Assistant:

static xmlRelaxNGStatesPtr
xmlRelaxNGNewStates(xmlRelaxNGValidCtxtPtr ctxt, int size)
{
    xmlRelaxNGStatesPtr ret;

    if ((ctxt != NULL) &&
        (ctxt->freeStates != NULL) && (ctxt->freeStatesNr > 0)) {
        ctxt->freeStatesNr--;
        ret = ctxt->freeStates[ctxt->freeStatesNr];
        ret->nbState = 0;
        return (ret);
    }
    if (size < 16)
        size = 16;

    ret = (xmlRelaxNGStatesPtr) xmlMalloc(sizeof(xmlRelaxNGStates) +
                                          (size -
                                           1) *
                                          sizeof(xmlRelaxNGValidStatePtr));
    if (ret == NULL) {
        xmlRngVErrMemory(ctxt, "allocating states\n");
        return (NULL);
    }
    ret->nbState = 0;
    ret->maxState = size;
    ret->tabState = (xmlRelaxNGValidStatePtr *) xmlMalloc((size) *
                                                          sizeof
                                                          (xmlRelaxNGValidStatePtr));
    if (ret->tabState == NULL) {
        xmlRngVErrMemory(ctxt, "allocating states\n");
        xmlFree(ret);
        return (NULL);
    }
    return (ret);
}